

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipField
               (CodedInputStream *input,uint32 tag,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  uint32 expected;
  CodedInputStream *input_00;
  long in_RDX;
  uint32 in_ESI;
  CodedInputStream *in_RDI;
  int in_stack_0000001c;
  string *in_stack_00000020;
  uint32 value_2;
  uint32 length;
  uint64 value_1;
  uint64 value;
  int number;
  uint64 *in_stack_ffffffffffffffa0;
  CodedInputStream *in_stack_ffffffffffffffa8;
  UnknownFieldSet *in_stack_ffffffffffffffb0;
  UnknownFieldSet *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  UnknownFieldSet *in_stack_ffffffffffffffd0;
  bool local_1;
  
  iVar2 = WireFormatLite::GetTagFieldNumber(in_ESI);
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    WVar3 = WireFormatLite::GetTagWireType(in_ESI);
    input_00 = (CodedInputStream *)(ulong)WVar3;
    switch(input_00) {
    case (CodedInputStream *)0x0:
      bVar1 = io::CodedInputStream::ReadVarint64
                        ((CodedInputStream *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (uint64 *)in_stack_ffffffffffffffc0);
      if (bVar1) {
        if (in_RDX != 0) {
          UnknownFieldSet::AddVarint
                    (in_stack_ffffffffffffffc0,(int)((ulong)input_00 >> 0x20),
                     (uint64)in_stack_ffffffffffffffb0);
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x1:
      bVar1 = io::CodedInputStream::ReadLittleEndian64
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (bVar1) {
        if (in_RDX != 0) {
          UnknownFieldSet::AddFixed64
                    (in_stack_ffffffffffffffc0,(int)((ulong)input_00 >> 0x20),
                     (uint64)in_stack_ffffffffffffffb0);
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x2:
      bVar1 = io::CodedInputStream::ReadVarint32(input_00,(uint32 *)in_stack_ffffffffffffffb0);
      if (bVar1) {
        if (in_RDX == 0) {
          bVar1 = io::CodedInputStream::Skip
                            (in_stack_ffffffffffffffa8,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          if (!bVar1) {
            return false;
          }
        }
        else {
          UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                    (in_stack_ffffffffffffffc0,(int)((ulong)input_00 >> 0x20));
          bVar1 = io::CodedInputStream::ReadString(_value_2,in_stack_00000020,in_stack_0000001c);
          if (!bVar1) {
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x3:
      bVar1 = io::CodedInputStream::IncrementRecursionDepth(in_RDI);
      if (bVar1) {
        if (in_RDX != 0) {
          UnknownFieldSet::AddGroup(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        bVar1 = SkipMessage(input_00,in_stack_ffffffffffffffb0);
        if (bVar1) {
          io::CodedInputStream::DecrementRecursionDepth(in_RDI);
          iVar2 = WireFormatLite::GetTagFieldNumber(in_ESI);
          expected = WireFormatLite::MakeTag(iVar2,WIRETYPE_END_GROUP);
          bVar1 = io::CodedInputStream::LastTagWas(in_RDI,expected);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x4:
      local_1 = false;
      break;
    case (CodedInputStream *)0x5:
      bVar1 = io::CodedInputStream::ReadLittleEndian32
                        (in_stack_ffffffffffffffa8,(uint32 *)in_stack_ffffffffffffffa0);
      if (bVar1) {
        if (in_RDX != 0) {
          UnknownFieldSet::AddFixed32
                    (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     (uint32)in_stack_ffffffffffffffa8);
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    default:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool WireFormat::SkipField(io::CodedInputStream* input, uint32 tag,
                           UnknownFieldSet* unknown_fields) {
  int number = WireFormatLite::GetTagFieldNumber(tag);
  // Field number 0 is illegal.
  if (number == 0) return false;

  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      if (unknown_fields != NULL) unknown_fields->AddVarint(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      if (unknown_fields != NULL) unknown_fields->AddFixed64(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      if (unknown_fields == NULL) {
        if (!input->Skip(length)) return false;
      } else {
        if (!input->ReadString(unknown_fields->AddLengthDelimited(number),
                               length)) {
          return false;
        }
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, (unknown_fields == NULL)
                                  ? NULL
                                  : unknown_fields->AddGroup(number))) {
        return false;
      }
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      if (unknown_fields != NULL) unknown_fields->AddFixed32(number, value);
      return true;
    }
    default: {
      return false;
    }
  }
}